

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::Simplex_tree
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,
          Simplex_tree<Gudhi::Simplex_tree_options_default> *complex_source)

{
  (this->nodes_label_to_list_)._M_h._M_buckets = &(this->nodes_label_to_list_)._M_h._M_single_bucket
  ;
  (this->nodes_label_to_list_)._M_h._M_bucket_count = 1;
  (this->nodes_label_to_list_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->nodes_label_to_list_)._M_h._M_element_count = 0;
  (this->nodes_label_to_list_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->nodes_label_to_list_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->nodes_label_to_list_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->root_).oncles_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)0x0;
  (this->root_).parent_ = -1;
  this->dimension_to_be_lowered_ = false;
  (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  (this->filtration_vect_).
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filtration_vect_).
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filtration_vect_).
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  move_from(this,complex_source);
  complex_source->dimension_ = -1;
  return;
}

Assistant:

Simplex_tree(Simplex_tree && complex_source) {
#ifdef DEBUG_TRACES
    std::clog << "Simplex_tree move constructor" << std::endl;
#endif  // DEBUG_TRACES
    move_from(complex_source);

    // just need to set dimension_ on source to make it available again
    // (filtration_vect_ and members are already set from the move)
    complex_source.dimension_ = -1;
  }